

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  long *plVar1;
  uv__iou *ctl;
  int __epfd;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint64_t uVar5;
  uv__queue *puVar6;
  uv__queue *puVar7;
  long lVar8;
  long lVar9;
  uv__statx *statxbuf;
  uv__io_s *puVar10;
  bool bVar11;
  bool bVar12;
  uint __timeout;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  uint64_t uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  epoll_event *e_00;
  uint uVar22;
  sigset_t *__set;
  bool bVar23;
  bool bVar24;
  uint local_3d40;
  int local_3d2c;
  int local_3d18;
  epoll_event e;
  uv__invalidate inv;
  sigset_t sigset;
  epoll_event prep [256];
  epoll_event events [1024];
  
  puVar4 = (uint *)loop->internal_fields;
  if ((loop->flags & 1) == 0) {
    __set = (__sigset_t *)0x0;
  }
  else {
    __set = (sigset_t *)&sigset;
    sigemptyset(__set);
    sigaddset(__set,0x1b);
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x510,"void uv__io_poll(uv_loop_t *, int)");
  }
  uVar5 = loop->time;
  uVar13 = *puVar4;
  uVar20 = uVar13 & 1;
  bVar23 = uVar20 == 0;
  __epfd = loop->backend_fd;
  e.data.u64._4_4_ = 0;
  e._0_8_ = 0;
  ctl = (uv__iou *)(puVar4 + 0x32);
  uVar20 = -uVar20 & timeout;
  while (puVar6 = (loop->watcher_queue).next, puVar6 != &loop->watcher_queue) {
    puVar7 = puVar6->next;
    puVar6->prev->next = puVar7;
    puVar7->prev = puVar6->prev;
    puVar6->next = puVar6;
    puVar6->prev = puVar6;
    bVar24 = *(int *)((long)&puVar6[1].next + 4) != 0;
    e.events = *(uint32_t *)&puVar6[1].next;
    *(uint32_t *)((long)&puVar6[1].next + 4) = e.events;
    e.data.fd = *(int *)&puVar6[1].prev;
    uv__epoll_ctl_prep(__epfd,ctl,&prep,bVar24 + 1 + (uint)bVar24,*(int *)&puVar6[1].prev,&e);
  }
  __timeout = 0;
  if ((uVar13 & 1) == 0) {
    __timeout = timeout;
  }
  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;
  local_3d18 = 0x30;
  local_3d40 = timeout;
  do {
    while( true ) {
      if ((loop->nfds == 0) && (puVar4[0x73] == 0)) goto LAB_0016c772;
      if (puVar4[0x50] != 0xffffffff) {
        while (**(int **)(puVar4 + 0x32) != **(int **)(puVar4 + 0x34)) {
          uv__epoll_ctl_flush(__epfd,ctl,&prep);
        }
      }
      if (__timeout != 0) {
        uv__metrics_set_provider_entry_time(loop);
      }
      puVar4[0x30] = __timeout;
      uVar13 = epoll_pwait(__epfd,(epoll_event *)events,0x400,__timeout,__set);
      piVar16 = __errno_location();
      iVar15 = *piVar16;
      uVar17 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar17 / 1000000;
      *piVar16 = iVar15;
      if (uVar13 != 0xffffffff) break;
      if (iVar15 != 4) {
        abort();
      }
      if (!bVar23) {
        __timeout = uVar20;
      }
joined_r0x0016c70b:
      bVar23 = true;
      if (__timeout != 0xffffffff) {
        if (__timeout == 0) goto LAB_0016c772;
        if ((int)__timeout < 1) {
          __assert_fail("timeout > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                        ,0x5ef,"void uv__io_poll(uv_loop_t *, int)");
        }
        local_3d40 = local_3d40 + ((int)uVar5 - (int)loop->time);
        bVar23 = true;
        __timeout = local_3d40;
        if ((int)local_3d40 < 1) goto LAB_0016c772;
      }
    }
    if (uVar13 == 0) {
      if (__timeout == 0xffffffff) {
        __assert_fail("timeout != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                      ,0x558,"void uv__io_poll(uv_loop_t *, int)");
      }
      if (!bVar23) {
        __timeout = uVar20;
      }
      goto joined_r0x0016c70b;
    }
    uVar21 = 0;
    uVar18 = 0;
    if (0 < (int)uVar13) {
      uVar18 = (ulong)uVar13;
    }
    *(uv__invalidate **)(puVar4 + 0x76) = &inv;
    bVar24 = false;
    local_3d2c = 0;
    bVar12 = false;
    inv.nfds = uVar13;
    while( true ) {
      if (uVar21 == uVar18) break;
      uVar22 = events[uVar21].data.fd;
      if ((ulong)uVar22 != 0xffffffff) {
        if (uVar22 == puVar4[0x72]) {
          uVar22 = **(uint **)(puVar4 + 0x5e);
          uVar2 = **(uint **)(puVar4 + 0x60);
          uVar3 = puVar4[0x62];
          lVar8 = *(long *)(puVar4 + 0x66);
          uVar14 = uVar2 - uVar22;
          for (; uVar2 != uVar22; uVar22 = uVar22 + 1) {
            lVar19 = (ulong)(uVar22 & uVar3) * 0x10;
            lVar9 = *(long *)(lVar8 + lVar19);
            if (*(int *)(lVar9 + 8) != 6) {
              __assert_fail("req->type == UV_FS",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                            ,0x441,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
            }
            if ((loop->active_reqs).count == 0) {
              __assert_fail("uv__has_active_reqs(loop)",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                            ,0x443,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
            }
            (loop->active_reqs).count = (loop->active_reqs).count - 1;
            puVar4[0x73] = puVar4[0x73] - 1;
            iVar15 = *(int *)(lVar19 + lVar8 + 8);
            *(long *)(lVar9 + 0x58) = (long)iVar15;
            if (*(int *)(lVar9 + 0x40) - 6U < 3) {
              statxbuf = *(uv__statx **)(lVar9 + 0x60);
              *(undefined8 *)(lVar9 + 0x60) = 0;
              if (iVar15 == 0) {
                uv__statx_to_stat(statxbuf,(uv_stat_t *)(lVar9 + 0x70));
                *(uv_stat_t **)(lVar9 + 0x60) = (uv_stat_t *)(lVar9 + 0x70);
              }
              uv__free(statxbuf);
            }
            uv__metrics_update_idle_time(loop);
            (**(code **)(lVar9 + 0x50))(lVar9);
          }
          **(uint **)(puVar4 + 0x5e) = uVar2;
          if ((**(uint **)(puVar4 + 0x5c) & 2) != 0) {
            do {
              iVar15 = uv__io_uring_enter(puVar4[0x72],0,0,1);
              if (iVar15 != -1) {
                if (-1 < iVar15) goto LAB_0016c629;
                break;
              }
            } while (*piVar16 == 4);
            perror("libuv: io_uring_enter(getevents)");
          }
LAB_0016c629:
          plVar1 = (long *)((long)loop->internal_fields + 0x10);
          *plVar1 = *plVar1 + (ulong)uVar14;
          if (*(int *)((long)loop->internal_fields + 0xc0) == 0) {
            plVar1 = (long *)((long)loop->internal_fields + 0x18);
            *plVar1 = *plVar1 + (ulong)uVar14;
          }
          bVar12 = true;
        }
        else {
          if ((int)uVar22 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                          ,0x593,"void uv__io_poll(uv_loop_t *, int)");
          }
          if (loop->nwatchers <= uVar22) {
            __assert_fail("(unsigned) fd < loop->nwatchers",
                          "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                          ,0x594,"void uv__io_poll(uv_loop_t *, int)");
          }
          e_00 = events + uVar21;
          puVar10 = loop->watchers[uVar22];
          if (puVar10 == (uv__io_s *)0x0) {
            uv__epoll_ctl_prep(__epfd,ctl,&prep,2,uVar22,e_00);
          }
          else {
            uVar22 = (puVar10->pevents | 0x18) & e_00->events;
            e_00->events = uVar22;
            if (uVar22 != 0) {
              if ((uVar22 == 0x10) || (uVar22 == 8)) {
                e_00->events = puVar10->pevents & 0x2007 | uVar22;
              }
              bVar11 = true;
              if (puVar10 != &loop->signal_io_watcher) {
                uv__metrics_update_idle_time(loop);
                (*puVar10->cb)(loop,puVar10,e_00->events);
                bVar11 = bVar24;
              }
              local_3d2c = local_3d2c + 1;
              bVar24 = bVar11;
            }
          }
        }
      }
      uVar21 = uVar21 + 1;
    }
    plVar1 = (long *)((long)loop->internal_fields + 0x10);
    *plVar1 = *plVar1 + (long)local_3d2c;
    if (!bVar23) {
      plVar1 = (long *)((long)loop->internal_fields + 0x18);
      *plVar1 = *plVar1 + (long)local_3d2c;
      __timeout = uVar20;
    }
    if (bVar24) {
      uv__metrics_update_idle_time(loop);
      (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
    }
    puVar4[0x76] = 0;
    puVar4[0x77] = 0;
    if (bVar12 || bVar24) break;
    if (local_3d2c == 0) goto joined_r0x0016c70b;
    if (uVar13 != 0x400) break;
    __timeout = 0;
    bVar23 = true;
    local_3d18 = local_3d18 + -1;
  } while (local_3d18 != 0);
LAB_0016c772:
  if (puVar4[0x50] != 0xffffffff) {
    while (**(int **)(puVar4 + 0x32) != **(int **)(puVar4 + 0x34)) {
      uv__epoll_ctl_flush(__epfd,ctl,&prep);
    }
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  uv__loop_internal_fields_t* lfields;
  struct epoll_event events[1024];
  struct epoll_event prep[256];
  struct uv__invalidate inv;
  struct epoll_event* pe;
  struct epoll_event e;
  struct uv__iou* ctl;
  struct uv__iou* iou;
  int real_timeout;
  struct uv__queue* q;
  uv__io_t* w;
  sigset_t* sigmask;
  sigset_t sigset;
  uint64_t base;
  int have_iou_events;
  int have_signals;
  int nevents;
  int epollfd;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  lfields = uv__get_internal_fields(loop);
  ctl = &lfields->ctl;
  iou = &lfields->iou;

  sigmask = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (lfields->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  epollfd = loop->backend_fd;

  memset(&e, 0, sizeof(e));

  while (!uv__queue_empty(&loop->watcher_queue)) {
    q = uv__queue_head(&loop->watcher_queue);
    w = uv__queue_data(q, uv__io_t, watcher_queue);
    uv__queue_remove(q);
    uv__queue_init(q);

    op = EPOLL_CTL_MOD;
    if (w->events == 0)
      op = EPOLL_CTL_ADD;

    w->events = w->pevents;
    e.events = w->pevents;
    e.data.fd = w->fd;

    uv__epoll_ctl_prep(epollfd, ctl, &prep, op, w->fd, &e);
  }

  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;

  for (;;) {
    if (loop->nfds == 0)
      if (iou->in_flight == 0)
        break;

    /* All event mask mutations should be visible to the kernel before
     * we enter epoll_pwait().
     */
    if (ctl->ringfd != -1)
      while (*ctl->sqhead != *ctl->sqtail)
        uv__epoll_ctl_flush(epollfd, ctl, &prep);

    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* Store the current timeout in a location that's globally accessible so
     * other locations like uv__work_done() can determine whether the queue
     * of events in the callback were waiting when poll was called.
     */
    lfields->current_timeout = timeout;

    nfds = epoll_pwait(epollfd, events, ARRAY_SIZE(events), timeout, sigmask);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        break;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno != EINTR)
        abort();

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        break;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_iou_events = 0;
    have_signals = 0;
    nevents = 0;

    inv.nfds = nfds;
    lfields->inv = &inv;

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      if (fd == iou->ringfd) {
        uv__poll_io_uring(loop, iou);
        have_iou_events = 1;
        continue;
      }

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        uv__epoll_ctl_prep(epollfd, ctl, &prep, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    uv__metrics_inc_events(loop, nevents);
    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
      uv__metrics_inc_events_waiting(loop, nevents);
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    lfields->inv = NULL;

    if (have_iou_events != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (have_signals != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      break;
    }

    if (timeout == 0)
      break;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      break;

    timeout = real_timeout;
  }

  if (ctl->ringfd != -1)
    while (*ctl->sqhead != *ctl->sqtail)
      uv__epoll_ctl_flush(epollfd, ctl, &prep);
}